

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O2

void json::JsonParser::parseObject(istream *input,JsonObject *parent)

{
  runtime_error *this;
  JsonToken current;
  undefined1 local_58 [40];
  
  JsonLexer::nextToken(&current,input);
  if (current.type != EndObject) {
    parseObjectMember(input,&current,parent);
    JsonLexer::nextToken((JsonToken *)local_58,input);
    JsonToken::operator=(&current,(JsonToken *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    while (current.type == ValueSeparator) {
      JsonLexer::nextToken((JsonToken *)local_58,input);
      JsonToken::operator=(&current,(JsonToken *)local_58);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      parseObjectMember(input,&current,parent);
      JsonLexer::nextToken((JsonToken *)local_58,input);
      JsonToken::operator=(&current,(JsonToken *)local_58);
      std::__cxx11::string::~string((string *)(local_58 + 8));
    }
    if (current.type != EndObject) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Could not read the end of the object");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)&current.value);
  return;
}

Assistant:

void JsonParser::parseObject(std::istream &input, JsonObject &parent)
    {
        JsonToken current = JsonLexer::nextToken(input);

        if (current.type == JsonTokenType::EndObject)
            return;

        parseObjectMember(input, current, parent);
        current = JsonLexer::nextToken(input);

        while (current.type == JsonTokenType::ValueSeparator)
        {
            current = JsonLexer::nextToken(input);
            parseObjectMember(input, current, parent);
            current = JsonLexer::nextToken(input);
        }

        if (current.type != JsonTokenType::EndObject)
            throw std::runtime_error("Could not read the end of the object");
    }